

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::asDirectory
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  bool bVar1;
  Own<const_kj::Directory,_std::nullptr_t> *this_00;
  Directory *pDVar2;
  SymlinkNode *this_01;
  Impl *this_02;
  int __flags;
  undefined4 in_register_0000000c;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar3;
  void *__child_stack;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *extraout_RDX_01;
  Directory *extraout_RDX_02;
  WriteMode a;
  void *in_R8;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar4;
  PathPtr path;
  Fault local_b0;
  Fault f_1;
  undefined1 local_98 [24];
  Fault f;
  undefined1 auStack_78 [7];
  DebugExpression<bool> _kjCondition;
  undefined4 local_70;
  undefined1 local_58 [8];
  Path newPath;
  WriteMode mode_local;
  EntryImpl *entry_local;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock_local;
  InMemoryDirectory *this_local;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_0000000c,mode);
  a = (WriteMode)in_R8;
  pEVar3 = ctx;
  bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::is<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                    ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      *)(ctx + 0x18));
  __flags = (int)pEVar3;
  if (bVar1) {
    this_00 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               ::get<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                         ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                           *)(ctx + 0x18))->directory;
    pDVar2 = Own<const_kj::Directory,_std::nullptr_t>::operator->(this_00);
    Directory::clone((Directory *)&newPath.parts.disposer,(__fn *)pDVar2,__child_stack,__flags,in_R8
                    );
    Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)this,
               (Own<const_kj::Directory,_std::nullptr_t> *)&newPath.parts.disposer);
    Own<const_kj::Directory,_std::nullptr_t>::~Own
              ((Own<const_kj::Directory,_std::nullptr_t> *)&newPath.parts.disposer);
    pDVar2 = extraout_RDX;
  }
  else {
    bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::is<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                        *)(ctx + 0x18));
    if (bVar1) {
      this_01 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                ::get<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                          ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                            *)(ctx + 0x18));
      SymlinkNode::parse((Path *)local_58,this_01);
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
      PathPtr::PathPtr((PathPtr *)auStack_78,(Path *)local_58);
      operator-(a,CREATE_PARENT);
      path.parts.size_ = _auStack_78;
      path.parts.ptr = (String *)lock;
      tryOpenSubdir(this,path,local_70);
      Path::~Path((Path *)local_58);
      pDVar2 = extraout_RDX_00;
    }
    else {
      bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
              ::operator==((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                            *)(ctx + 0x18),(void *)0x0);
      if (bVar1) {
        f.exception._6_1_ = has<kj::WriteMode,void>(a,CREATE);
        f.exception._7_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (bool *)((long)&f.exception + 6));
        bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f.exception + 7));
        if (!bVar1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    ((Fault *)(local_98 + 0x10),
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x6c8,FAILED,"has(mode, WriteMode::CREATE)","_kjCondition,",
                     (DebugExpression<bool> *)((long)&f.exception + 7));
          kj::_::Debug::Fault::fatal((Fault *)(local_98 + 0x10));
        }
        this_02 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                            ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
        Impl::modified(this_02);
        Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                  ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
        Impl::newDirectory((Impl *)&f_1);
        EntryImpl::init((EntryImpl *)local_98,ctx);
        Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)this,
                   (Own<const_kj::Directory,_std::nullptr_t> *)local_98);
        Own<const_kj::Directory,_std::nullptr_t>::~Own
                  ((Own<const_kj::Directory,_std::nullptr_t> *)local_98);
        DirectoryNode::~DirectoryNode((DirectoryNode *)&f_1);
        pDVar2 = extraout_RDX_01;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                  (&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x6cc,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0xa8540a);
        Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)this);
        kj::_::Debug::Fault::~Fault(&local_b0);
        pDVar2 = extraout_RDX_02;
      }
    }
  }
  MVar4.ptr.ptr = pDVar2;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<const Directory>> asDirectory(
      kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<DirectoryNode>()) {
      return entry.node.get<DirectoryNode>().directory->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenSubdir(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(DirectoryNode { lock->newDirectory() });
    } else {
      KJ_FAIL_REQUIRE("not a directory") { return kj::none; }
    }
  }